

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxRandom2::Emit(FxRandom2 *this,VMFunctionBuilder *build)

{
  _func_int **ptr;
  bool bVar1;
  uint uVar2;
  DObject *this_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  FName local_34;
  
  this_00 = (DObject *)FindBuiltinFunction(&local_34,BuiltinRandom);
  bVar1 = DObject::IsKindOf(this_00,PSymbolVMFunction::RegistrationInfo.MyClass);
  if (!bVar1) {
    __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x1572,"virtual ExpEmit FxRandom2::Emit(VMFunctionBuilder *)");
  }
  ptr = this_00[1]._vptr_DObject;
  if (ptr != (_func_int **)0x0) {
    bVar1 = this->EmitTail;
    uVar2 = VMFunctionBuilder::GetConstantAddress(build,this->rng,'\x02');
    uVar5 = 0;
    VMFunctionBuilder::Emit(build,0x46,0,7,uVar2);
    EmitParameter(build,this->mask,&(this->super_FxExpression).ScriptPosition);
    uVar2 = VMFunctionBuilder::GetConstantAddress(build,ptr,'\x01');
    VMFunctionBuilder::Emit(build,(uint)bVar1 + (uint)bVar1 * 2 + 0x49,uVar2,2,1);
    if (this->EmitTail == false) {
      uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
      uVar5 = (ulong)(uVar2 & 0xffff);
      uVar4 = 0;
      VMFunctionBuilder::Emit(build,0x4d,0,0,uVar2 & 0xffff);
      uVar3 = 0x1000000;
    }
    else {
      uVar4 = 0x800000;
      uVar3 = 0x1000001000000;
    }
    return (ExpEmit)(uVar3 | uVar4 | uVar5);
  }
  __assert_fail("((PSymbolVMFunction *)sym)->Function != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x1573,"virtual ExpEmit FxRandom2::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxRandom2::Emit(VMFunctionBuilder *build)
{
	// Call the BuiltinRandom function to generate the random number.
	VMFunction *callfunc;
	PSymbol *sym = FindBuiltinFunction(NAME_BuiltinRandom, BuiltinRandom);

	assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction)));
	assert(((PSymbolVMFunction *)sym)->Function != nullptr);
	callfunc = ((PSymbolVMFunction *)sym)->Function;

	int opcode = (EmitTail ? OP_TAIL_K : OP_CALL_K);

	build->Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, build->GetConstantAddress(rng, ATAG_RNG));
	EmitParameter(build, mask, ScriptPosition);
	build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 2, 1);

	if (EmitTail)
	{
		ExpEmit call;
		call.Final = true;
		return call;
	}

	ExpEmit out(build, REGT_INT);
	build->Emit(OP_RESULT, 0, REGT_INT, out.RegNum);
	return out;
}